

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall mp::internal::SignalHandler::~SignalHandler(SignalHandler *this)

{
  atomic<bool_(*)(void_*)> *in_RDI;
  __pointer_type in_stack_ffffffffffffffe8;
  atomic<bool_(*)(void_*)> *this_00;
  
  (in_RDI->_M_b)._M_p = (__pointer_type)&PTR__SignalHandler_0097b160;
  this_00 = in_RDI;
  BasicSolver::set_interrupter((BasicSolver *)in_RDI[1]._M_b._M_p,(Interrupter *)0x0);
  stop_ = 1;
  std::atomic<bool_(*)(void_*)>::operator=(in_RDI,in_stack_ffffffffffffffe8);
  std::__atomic_base<unsigned_int>::operator=
            ((__atomic_base<unsigned_int> *)this_00,(__int_type)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  Interrupter::~Interrupter((Interrupter *)in_RDI);
  return;
}

Assistant:

SignalHandler::~SignalHandler() {
  solver_.set_interrupter(0);
  stop_ = 1;
  handler_ = 0;
  signal_message_size_ = 0;
}